

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  Tokenizer *pTVar1;
  pointer pcVar2;
  string *psVar3;
  ErrorCollector *pEVar4;
  bool bVar5;
  bool bVar6;
  Type *field;
  string extendee;
  LocationRecorder location;
  Token extendee_end;
  Token extendee_start;
  LocationRecorder extendee_location;
  string local_100;
  LocationRecorder local_e0;
  undefined1 local_d0 [40];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  ColumnNumber local_80;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined8 local_50;
  ColumnNumber local_48;
  LocationRecorder local_40;
  
  local_d0._16_8_ = messages;
  local_d0._24_8_ = parent_location;
  bVar5 = Consume(this,"extend");
  if (bVar5) {
    pTVar1 = this->input_;
    local_78._0_4_ = (pTVar1->current_).type;
    local_78._8_8_ = &local_60;
    pcVar2 = (pTVar1->current_).text._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 8),pcVar2,pcVar2 + (pTVar1->current_).text._M_string_length);
    local_48 = (pTVar1->current_).end_column;
    local_50._0_4_ = (pTVar1->current_).line;
    local_50._4_4_ = (pTVar1->current_).column;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    bVar5 = ParseUserDefinedType(this,&local_100);
    if (bVar5) {
      pTVar1 = this->input_;
      local_d0._32_4_ = (pTVar1->previous_).type;
      local_a8._M_p = (pointer)&local_98;
      pcVar2 = (pTVar1->previous_).text._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + (pTVar1->previous_).text._M_string_length);
      local_80 = (pTVar1->previous_).end_column;
      local_88._M_p = *(pointer *)&(pTVar1->previous_).line;
      bVar5 = ConsumeEndOfDeclaration(this,"{",extend_location);
      if (bVar5) {
        bVar5 = true;
        do {
          if ((this->input_->current_).type == TYPE_END) {
            local_e0.parser_ = (Parser *)local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,
                       "Reached end of input in extend definition (missing \'}\').","");
            pEVar4 = this->error_collector_;
            if (pEVar4 != (ErrorCollector *)0x0) {
              (*pEVar4->_vptr_ErrorCollector[2])
                        (pEVar4,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,&local_e0);
            }
            this->had_errors_ = true;
            if (local_e0.parser_ != (Parser *)local_d0) {
              operator_delete(local_e0.parser_,(ulong)((long)&((Token *)local_d0._0_8_)->type + 1));
            }
            goto LAB_002cc9c1;
          }
          LocationRecorder::LocationRecorder
                    (&local_e0,extend_location,
                     (extensions->super_RepeatedPtrFieldBase).current_size_);
          field = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                            (&extensions->super_RepeatedPtrFieldBase,(Type *)0x0);
          LocationRecorder::LocationRecorder(&local_40,&local_e0,2);
          LocationRecorder::StartAt(&local_40,(Token *)local_78);
          LocationRecorder::EndAt(&local_40,(Token *)(local_d0 + 0x20));
          if (bVar5) {
            LocationRecorder::RecordLegacyLocation(&local_40,&field->super_Message,EXTENDEE);
          }
          LocationRecorder::~LocationRecorder(&local_40);
          *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 2;
          psVar3 = (field->extendee_).ptr_;
          if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena(&field->extendee_,&local_100);
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar3);
          }
          bVar5 = ParseMessageField(this,field,
                                    (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                                    local_d0._16_8_,(LocationRecorder *)local_d0._24_8_,
                                    location_field_number_for_nested_type,&local_e0,containing_file)
          ;
          if (!bVar5) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_e0);
          bVar6 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
          bVar5 = false;
        } while (!bVar6);
        bVar5 = true;
      }
      else {
LAB_002cc9c1:
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &local_98) {
        operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._8_8_ != &local_60) {
      operator_delete((void *)local_78._8_8_,local_60._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      AddError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type,
                           location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}